

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::vectorNormalize<3u,4u>(GLfloat *data,GLuint index)

{
  uint uVar1;
  float fVar2;
  uint local_38;
  GLuint i_1;
  GLfloat factor;
  GLfloat length;
  GLfloat component;
  GLuint i;
  GLfloat sqr_length;
  GLfloat *components;
  GLuint index_local;
  GLfloat *data_local;
  
  uVar1 = index << 2;
  component = 0.0;
  for (length = 0.0; (uint)length < 3; length = (GLfloat)((int)length + 1)) {
    component = data[(ulong)uVar1 + (ulong)(uint)length] * data[(ulong)uVar1 + (ulong)(uint)length]
                + component;
  }
  fVar2 = sqrtf(component);
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    data[(ulong)uVar1 + (ulong)local_38] = (1.0 / fVar2) * data[(ulong)uVar1 + (ulong)local_38];
  }
  return;
}

Assistant:

void vectorNormalize(glw::GLfloat* data, glw::GLuint index)
{
	glw::GLfloat* components = data + index * N_Components;

	glw::GLfloat sqr_length = 0.0f;

	for (glw::GLuint i = 0; i < N_NormalizedComponents; ++i)
	{
		const glw::GLfloat component = components[i];

		sqr_length += component * component;
	}

	const glw::GLfloat length = sqrtf(sqr_length);
	const glw::GLfloat factor = 1.0f / length;

	for (glw::GLuint i = 0; i < N_NormalizedComponents; ++i)
	{
		components[i] *= factor;
	}
}